

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O0

void __thiscall rudp::rudp_server::receive(rudp_server *this)

{
  static_vector<unsigned_char,_2048UL,_void> *this_00;
  basic_endpoint<boost::asio::ip::udp> *this_01;
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  *pvVar1;
  uchar *data_00;
  size_type size_in_bytes;
  element_type *sender_endpoint;
  anon_class_40_3_881517fd local_78;
  mutable_buffer local_50;
  undefined1 local_40 [8];
  shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> from;
  undefined1 local_20 [8];
  buffer_ptr_t data;
  rudp_server *this_local;
  
  data.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_00 = (static_vector<unsigned_char,_2048UL,_void> *)operator_new(0x808);
  boost::container::static_vector<unsigned_char,_2048UL,_void>::static_vector(this_00,0x800);
  std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>::
  shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>,void>
            ((shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>> *)local_20,
             this_00);
  this_01 = (basic_endpoint<boost::asio::ip::udp> *)operator_new(0x1c);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint(this_01);
  std::shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>::
  shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,void>
            ((shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>> *)local_40,this_01);
  pvVar1 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_20)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  data_00 = boost::container::
            vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
            ::data(pvVar1);
  pvVar1 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_20)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  size_in_bytes =
       boost::container::
       vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
       ::size(pvVar1);
  local_50 = (mutable_buffer)boost::asio::buffer(data_00,size_in_bytes);
  sender_endpoint =
       std::
       __shared_ptr_access<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator*((__shared_ptr_access<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_40);
  local_78.this = this;
  std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::shared_ptr
            (&local_78.data,
             (shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)local_20);
  std::shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>::shared_ptr
            (&local_78.from,
             (shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> *)local_40);
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_receive_from<boost::asio::mutable_buffers_1,rudp::rudp_server::receive()::_lambda(boost::system::error_code_const&,unsigned_long)_1_>
            ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->socket,(mutable_buffers_1 *)&local_50,sender_endpoint,&local_78);
  receive()::{lambda(boost::system::error_code_const&,unsigned_long)#1}::~error_code
            ((_lambda_boost__system__error_code_const__unsigned_long__1_ *)&local_78);
  std::shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>::~shared_ptr
            ((shared_ptr<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> *)local_40);
  std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::~shared_ptr
            ((shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)local_20);
  return;
}

Assistant:

void receive() {
    buffer_ptr_t data( new buffer_t( buffer_size ) );
    using boost::asio::ip::udp;
    std::shared_ptr< udp::endpoint > from( new udp::endpoint() );
    socket.async_receive_from(
      boost::asio::buffer( data->data(), data->size() ),
      *from,
      [this,data,from](
        const boost::system::error_code& error,
        size_t size
      ) {
        if( likely( !error ) ) {
          data->resize( size );
          receive();
	         auto &sess = sessions[ *from ];
	         if( !sess && is_syn( *data ) ) {
            sess.reset( new session( io_service, socket, *from, [this]( const boost::asio::ip::udp::endpoint &endpoint ) {
              auto s = sessions.find( endpoint );
              if( s != sessions.end() ) {
                session_bindings.erase( s->second->get_self_config().connection_identifier );
                sessions.erase( s );
              }
            } ) );
            session_bindings.insert( std::make_pair( sess->get_self_config().connection_identifier, *from ) );
          }
          if( sess ) {
            buffers_ptr_t received( new buffers_t() );
	           buffers_t response;
	           auto received_iter = std::back_inserter( *received );
            try {
	             sess->receive( data, received_iter );
	             if( !received->empty() )
                cb( *this, sess->get_self_config().connection_identifier, received );
              if( is_rst( *data ) ) {
                auto s = sessions.find( *from );
                if( s != sessions.end() ) {
                  session_bindings.erase( s->second->get_self_config().connection_identifier );
                  sessions.erase( s );
                }
              }
            } catch( const invalid_packet& ) {
              std::cout << "invalid packet" << std::endl;
            }
          }
        }
      }
    );
  }